

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int is_mixedcase(char *str)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  ushort uVar4;
  ushort uVar5;
  size_t sVar6;
  ushort uVar7;
  ushort uVar8;
  
  iVar1 = 0;
  if ((str != (char *)0x0) && (*str != '\0')) {
    sVar2 = strlen(str);
    sVar6 = 0;
    uVar4 = 0;
    uVar8 = 0;
    do {
      if (sVar2 == sVar6) {
        return 0;
      }
      uVar5 = 1;
      if (uVar4 == 0) {
        ppuVar3 = __ctype_b_loc();
        uVar5 = (*ppuVar3)[str[sVar6]] >> 9 & 1;
      }
      uVar7 = 1;
      if (uVar8 == 0) {
        ppuVar3 = __ctype_b_loc();
        uVar7 = (*ppuVar3)[str[sVar6]] >> 8 & 1;
      }
      iVar1 = 1;
      sVar6 = sVar6 + 1;
      uVar4 = uVar5;
      uVar8 = uVar7;
    } while ((byte)((byte)uVar5 & (byte)uVar7) != 1);
  }
  return iVar1;
}

Assistant:

static int is_mixedcase(const char * str)
{
   size_t c;
   int hasupper = 0, haslower = 0;

   if( !str || !*str ) return 0;

   for(c = 0; c < strlen(str); c++ ) {
     if( !haslower && islower((int) str[c]) ) haslower = 1;
     if( !hasupper && isupper((int) str[c]) ) hasupper = 1;

      if( haslower && hasupper ) return 1;
   }

   return 0;
}